

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCodeSubselect(Parse *pParse,Expr *pExpr)

{
  char *in_RSI;
  int reg;
  Expr *in_stack_00000030;
  Parse *in_stack_00000038;
  undefined4 local_14;
  
  local_14 = 0;
  if (*in_RSI == -0x75) {
    local_14 = sqlite3CodeSubselect(in_stack_00000038,in_stack_00000030);
  }
  return local_14;
}

Assistant:

static int exprCodeSubselect(Parse *pParse, Expr *pExpr){
  int reg = 0;
#ifndef SQLITE_OMIT_SUBQUERY
  if( pExpr->op==TK_SELECT ){
    reg = sqlite3CodeSubselect(pParse, pExpr);
  }
#endif
  return reg;
}